

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  pointer pcVar1;
  bool bVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  CacheEntryType CVar6;
  long lVar7;
  long lVar8;
  mapped_type *pmVar9;
  char *__s;
  ostream *poVar10;
  mapped_type mVar11;
  string *psVar12;
  string *key;
  size_type sVar13;
  pointer pbVar14;
  _Alloc_hider _Var15;
  uint uVar16;
  ulong uVar17;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entriesToDelete;
  CacheEntryType type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  string arg;
  string entry;
  string local_198;
  undefined1 local_178 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148 [17];
  undefined7 uStack_137;
  ulong local_128;
  long *local_120;
  long local_118;
  long local_110 [2];
  undefined1 local_100 [184];
  char *local_48;
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar4 = true;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14)) {
    local_158._M_allocated_capacity = (size_type)&this->DiagLevels;
    local_128 = 0;
    uVar17 = 1;
    do {
      local_120 = local_110;
      pcVar1 = pbVar14[uVar17]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,pcVar1,pcVar1 + pbVar14[uVar17]._M_string_length);
      lVar7 = std::__cxx11::string::find((char *)&local_120,0x4df35a,0);
      uVar16 = (uint)uVar17;
      if (lVar7 == 0) {
        std::__cxx11::string::substr((ulong)local_100,(ulong)&local_120);
        if ((char *)local_100._8_8_ == (char *)0x0) {
          uVar16 = uVar16 + 1;
          if ((ulong)uVar16 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)local_100);
            goto LAB_0029312f;
          }
          bVar4 = false;
          cmSystemTools::Error
                    ("-D must be followed with VAR=VALUE.",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
LAB_0029312f:
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          local_198._M_string_length = 0;
          local_198.field_2._M_local_buf[0] = '\0';
          local_178._0_8_ = local_178 + 0x10;
          local_178._8_8_ = (string *)0x0;
          local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
          local_158._12_4_ = UNINITIALIZED;
          bVar4 = cmState::ParseCacheEntry
                            ((string *)local_100,&local_198,(string *)local_178,
                             (CacheEntryType *)(local_158._M_local_buf + 0xc));
          if (bVar4) {
            local_148._0_8_ = local_148 + 0x10;
            local_148._8_8_ = (string *)0x0;
            local_148[0x10] = 0;
            if ((this->WarnUnusedCli == true) &&
               (__s = cmState::GetInitializedCacheValue(this->State,&local_198),
               uVar3 = local_148._8_8_, __s != (char *)0x0)) {
              strlen(__s);
              bVar2 = true;
              std::__cxx11::string::_M_replace((ulong)local_148,0,(char *)uVar3,(ulong)__s);
            }
            else {
              bVar2 = false;
            }
            cmState::AddCacheEntry
                      (this->State,&local_198,(char *)local_178._0_8_,
                       "No help, variable specified on the command line.",local_158._12_4_);
            UnwatchUnusedCli(this,&local_198);
            if (this->WarnUnusedCli == true) {
              if (bVar2) {
                cmState::GetInitializedCacheValue(this->State,&local_198);
                iVar5 = std::__cxx11::string::compare(local_148);
                if (iVar5 == 0) goto LAB_00293443;
              }
              WatchUnusedCli(this,&local_198);
            }
LAB_00293443:
            if ((string *)local_148._0_8_ != (string *)(local_148 + 0x10)) {
              operator_delete((void *)local_148._0_8_,CONCAT71(uStack_137,local_148[0x10]) + 1);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Parse error in command line argument: ",0x26);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_120,local_118);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"Should be: VAR:type=value\n",0x1a);
            cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          if ((string *)local_178._0_8_ != (string *)(local_178 + 0x10)) {
            operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,
                            CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                     local_198.field_2._M_local_buf[0]) + 1);
          }
        }
LAB_002936b8:
        sVar13 = local_100._16_8_;
        _Var15._M_p = (pointer)local_100._0_8_;
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
LAB_002936d5:
          operator_delete(_Var15._M_p,sVar13 + 1);
        }
LAB_002936dd:
        if (bVar4 == false) {
LAB_0029379b:
          bVar4 = false;
        }
        else {
LAB_002936e5:
          bVar4 = true;
        }
      }
      else {
        if (((char)*local_120 != '-') || (*(char *)((long)local_120 + 1) != 'W')) {
          lVar7 = std::__cxx11::string::find((char *)&local_120,0x4cb83b,0);
          if (lVar7 == 0) {
            std::__cxx11::string::substr((ulong)&local_198,(ulong)&local_120);
            if (local_198._M_string_length == 0) {
              uVar16 = uVar16 + 1;
              if ((ulong)uVar16 <
                  (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5)) {
                std::__cxx11::string::_M_assign((string *)&local_198);
                goto LAB_00293246;
              }
              bVar4 = false;
              cmSystemTools::Error
                        ("-U must be followed with VAR.",(char *)0x0,(char *)0x0,(char *)0x0);
            }
            else {
LAB_00293246:
              cmsys::Glob::PatternToRegex((string *)local_178,&local_198,true,true);
              local_48 = (char *)0x0;
              if ((string *)local_178._0_8_ == (string *)0x0) {
                psVar12 = (string *)0x0;
LAB_0029353a:
                operator_delete(psVar12,local_178._16_8_ + 1);
              }
              else {
                cmsys::RegularExpression::compile
                          ((RegularExpression *)local_100,(char *)local_178._0_8_);
                psVar12 = (string *)local_178._0_8_;
                if ((string *)local_178._0_8_ != (string *)(local_178 + 0x10)) goto LAB_0029353a;
              }
              local_178._0_8_ = (string *)0x0;
              local_178._8_8_ = (string *)0x0;
              local_178._16_8_ = 0;
              cmState::GetCacheEntryKeys_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_148,this->State);
              for (psVar12 = (string *)local_148._0_8_; key = (string *)local_178._0_8_,
                  psVar12 != (string *)local_148._8_8_; psVar12 = psVar12 + 1) {
                CVar6 = cmState::GetCacheEntryType(this->State,psVar12);
                if ((CVar6 != STATIC) &&
                   (bVar4 = cmsys::RegularExpression::find
                                      ((RegularExpression *)local_100,(psVar12->_M_dataplus)._M_p),
                   bVar4)) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_178,psVar12);
                }
              }
              for (; key != (string *)local_178._8_8_; key = key + 1) {
                cmState::RemoveCacheEntry(this->State,key);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_148);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_178);
              if (local_48 != (char *)0x0) {
                operator_delete__(local_48);
              }
              bVar4 = true;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              sVar13 = CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                local_198.field_2._M_local_buf[0]);
              _Var15._M_p = local_198._M_dataplus._M_p;
              goto LAB_002936d5;
            }
            goto LAB_002936dd;
          }
          lVar7 = std::__cxx11::string::find((char *)&local_120,0x4cb85c,0);
          if (lVar7 == 0) {
            std::__cxx11::string::substr((ulong)local_100,(ulong)&local_120);
            if ((char *)local_100._8_8_ == (char *)0x0) {
              uVar16 = uVar16 + 1;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar16) {
                bVar4 = false;
                cmSystemTools::Error
                          ("-C must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0
                          );
                goto LAB_002936b8;
              }
              std::__cxx11::string::_M_assign((string *)local_100);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"loading initial cache file ",0x1b);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)local_100._0_8_,local_100._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            bVar4 = true;
            ReadListFile(this,args,(char *)local_100._0_8_);
            goto LAB_002936b8;
          }
          lVar7 = std::__cxx11::string::find((char *)&local_120,0x4be141,0);
          if (lVar7 != 0) {
            lVar7 = std::__cxx11::string::find((char *)&local_120,0x4be144,0);
            local_128 = CONCAT71((int7)(local_128 >> 8),(byte)local_128 | lVar7 == 0);
            goto LAB_002936e5;
          }
          uVar16 = uVar16 + 1;
          uVar17 = (ulong)uVar16;
          pbVar14 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5) <=
              uVar17) {
            bVar4 = false;
            cmSystemTools::Error
                      ("-P must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
            goto LAB_0029379d;
          }
          local_100._0_8_ = local_100 + 0x10;
          pcVar1 = pbVar14[uVar17]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_100,pcVar1,pcVar1 + pbVar14[uVar17]._M_string_length);
          uVar3 = local_100._8_8_;
          if ((char *)local_100._8_8_ == (char *)0x0) {
            cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else {
            ReadListFile(this,args,(char *)local_100._0_8_);
          }
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
            operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
          }
          if ((char *)uVar3 != (char *)0x0) goto LAB_002936e5;
          goto LAB_0029379b;
        }
        std::__cxx11::string::substr((ulong)local_100,(ulong)&local_120);
        if ((char *)local_100._8_8_ == (char *)0x0) {
          uVar16 = uVar16 + 1;
          if ((ulong)uVar16 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)local_100);
            goto LAB_00292f2b;
          }
          bVar4 = false;
          cmSystemTools::Error
                    ("-W must be followed with [no-]<name>.",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
LAB_00292f2b:
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          local_198._M_string_length = 0;
          local_198.field_2._M_local_buf[0] = '\0';
          lVar7 = std::__cxx11::string::find(local_100,0x4cb816,0);
          lVar8 = std::__cxx11::string::find(local_100,0x4cb81a,(ulong)((uint)(lVar7 == 0) * 3));
          std::__cxx11::string::substr((ulong)local_178,(ulong)local_100);
          std::__cxx11::string::operator=((string *)&local_198,(string *)local_178);
          if ((string *)local_178._0_8_ != (string *)(local_178 + 0x10)) {
            operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
          }
          bVar4 = local_198._M_string_length != 0;
          if (local_198._M_string_length == 0) {
            cmSystemTools::Error("No warning name provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          else if (lVar7 == 0 || lVar8 == 0) {
            if (lVar7 == 0 && lVar8 != 0) {
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                                     *)local_158._M_allocated_capacity,&local_198);
              *pmVar9 = DIAG_IGNORE;
            }
            else {
              if ((lVar7 == 0) || (lVar8 != 0)) {
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                                       *)local_158._M_allocated_capacity,&local_198);
                mVar11 = *pmVar9;
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                                       *)local_158._M_allocated_capacity,&local_198);
                if (0 < (int)mVar11) {
                  mVar11 = DIAG_WARN;
                }
                goto LAB_00293654;
              }
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                                     *)local_158._M_allocated_capacity,&local_198);
              *pmVar9 = DIAG_ERROR;
            }
          }
          else {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                                   *)local_158._M_allocated_capacity,&local_198);
            mVar11 = *pmVar9;
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                                   *)local_158._M_allocated_capacity,&local_198);
            if ((int)mVar11 < 2) {
              mVar11 = DIAG_WARN;
            }
LAB_00293654:
            *pmVar9 = mVar11;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,
                            CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                     local_198.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
        }
        if (bVar4) goto LAB_002936e5;
        bVar4 = false;
      }
LAB_0029379d:
      if (local_120 != local_110) {
        operator_delete(local_120,local_110[0] + 1);
      }
      if (!bVar4) {
        return false;
      }
      uVar17 = (ulong)(uVar16 + 1);
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5
                             ));
    bVar4 = true;
    if ((local_128 & 1) != 0) {
      bVar4 = FindPackage(this,args);
    }
  }
  return bVar4;
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  bool findPackageMode = false;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-D",0) == 0)
      {
      std::string entry = arg.substr(2);
      if(entry.empty())
        {
        ++i;
        if(i < args.size())
          {
          entry = args[i];
          }
        else
          {
          cmSystemTools::Error("-D must be followed with VAR=VALUE.");
          return false;
          }
        }
      std::string var, value;
      cmState::CacheEntryType type = cmState::UNINITIALIZED;
      if(cmState::ParseCacheEntry(entry, var, value, type))
        {
        // The value is transformed if it is a filepath for example, so
        // we can't compare whether the value is already in the cache until
        // after we call AddCacheEntry.
        bool haveValue = false;
        std::string cachedValue;
        if(this->WarnUnusedCli)
          {
          if(const char *v = this->State->GetInitializedCacheValue(var))
            {
            haveValue = true;
            cachedValue = v;
            }
          }

        this->AddCacheEntry(var, value.c_str(),
          "No help, variable specified on the command line.", type);

        if(this->WarnUnusedCli)
          {
          if (!haveValue ||
              cachedValue != this->State->GetInitializedCacheValue(var))
            {
            this->WatchUnusedCli(var);
            }
          }
        }
      else
        {
        std::cerr << "Parse error in command line argument: " << arg << "\n"
                  << "Should be: VAR:type=value\n";
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      }
    else if(cmHasLiteralPrefix(arg, "-W"))
      {
      std::string entry = arg.substr(2);
      if (entry.empty())
        {
        ++i;
        if (i < args.size())
          {
          entry = args[i];
          }
        else
          {
          cmSystemTools::Error("-W must be followed with [no-]<name>.");
          return false;
          }
        }

      std::string name;
      bool foundNo = false;
      bool foundError = false;
      unsigned int nameStartPosition = 0;

      if (entry.find("no-", nameStartPosition) == 0)
        {
        foundNo = true;
        nameStartPosition += 3;
        }

      if (entry.find("error=", nameStartPosition) == 0)
        {
        foundError = true;
        nameStartPosition += 6;
        }

      name = entry.substr(nameStartPosition);
      if (name.empty())
        {
        cmSystemTools::Error("No warning name provided.");
        return false;
        }

      if (!foundNo && !foundError)
        {
        // -W<name>
        this->DiagLevels[name] = std::max(this->DiagLevels[name],
                                          DIAG_WARN);
        }
      else if (foundNo && !foundError)
        {
         // -Wno<name>
         this->DiagLevels[name] = DIAG_IGNORE;
        }
      else if (!foundNo && foundError)
        {
        // -Werror=<name>
        this->DiagLevels[name] = DIAG_ERROR;
        }
      else
        {
        // -Wno-error=<name>
        this->DiagLevels[name] = std::min(this->DiagLevels[name],
                                          DIAG_WARN);
        }
      }
    else if(arg.find("-U",0) == 0)
      {
      std::string entryPattern = arg.substr(2);
      if(entryPattern.empty())
        {
        ++i;
        if(i < args.size())
          {
          entryPattern = args[i];
          }
        else
          {
          cmSystemTools::Error("-U must be followed with VAR.");
          return false;
          }
        }
      cmsys::RegularExpression regex(
        cmsys::Glob::PatternToRegex(entryPattern, true, true).c_str());
      //go through all cache entries and collect the vars which will be removed
      std::vector<std::string> entriesToDelete;
      std::vector<std::string> cacheKeys = this->State->GetCacheEntryKeys();
      for (std::vector<std::string>::const_iterator it = cacheKeys.begin();
            it != cacheKeys.end(); ++it)
        {
        cmState::CacheEntryType t = this->State->GetCacheEntryType(*it);
        if(t != cmState::STATIC)
          {
          if (regex.find(it->c_str()))
            {
            entriesToDelete.push_back(*it);
            }
          }
        }

      // now remove them from the cache
      for(std::vector<std::string>::const_iterator currentEntry =
          entriesToDelete.begin();
          currentEntry != entriesToDelete.end();
          ++currentEntry)
        {
        this->State->RemoveCacheEntry(*currentEntry);
        }
      }
    else if(arg.find("-C",0) == 0)
      {
      std::string path = arg.substr(2);
      if (path.empty())
        {
        ++i;
        if(i < args.size())
          {
          path = args[i];
          }
        else
          {
          cmSystemTools::Error("-C must be followed by a file name.");
          return false;
          }
        }
      std::cout << "loading initial cache file " << path << "\n";
      this->ReadListFile(args, path.c_str());
      }
    else if(arg.find("-P",0) == 0)
      {
      i++;
      if(i >= args.size())
        {
        cmSystemTools::Error("-P must be followed by a file name.");
        return false;
        }
      std::string path = args[i];
      if (path.empty())
        {
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      this->ReadListFile(args, path.c_str());
      }
    else if (arg.find("--find-package",0) == 0)
      {
      findPackageMode = true;
      }
    }

  if (findPackageMode)
    {
    return this->FindPackage(args);
    }

  return true;
}